

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

bool ImGui::SFML::Init(Window *window,Vector2f *displaySize,bool loadDefaultFont)

{
  uint uVar1;
  WindowContext *this;
  reference this_00;
  ImVec2 local_50;
  ImGuiIO *local_48;
  ImGuiIO *io;
  WindowContext *local_30;
  byte local_21;
  Vector2f *pVStack_20;
  bool loadDefaultFont_local;
  Vector2f *displaySize_local;
  Window *window_local;
  
  local_21 = loadDefaultFont;
  pVStack_20 = displaySize;
  displaySize_local = (Vector2f *)window;
  this = (WindowContext *)operator_new(0x120);
  anon_unknown.dwarf_f6bf2::WindowContext::WindowContext(this,(Window *)displaySize_local);
  local_30 = this;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>,std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>>>
  ::emplace_back<(anonymous_namespace)::WindowContext*>
            ((vector<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>,std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,std::default_delete<(anonymous_namespace)::WindowContext>>>>
              *)(anonymous_namespace)::s_windowContexts,&local_30);
  this_00 = std::
            vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
            ::back((vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
                    *)(anonymous_namespace)::s_windowContexts);
  (anonymous_namespace)::s_currWindowCtx =
       std::
       unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>
       ::get(this_00);
  SetCurrentContext((anonymous_namespace)::s_currWindowCtx->imContext);
  local_48 = GetIO();
  local_48->BackendFlags = local_48->BackendFlags | 1;
  local_48->BackendFlags = local_48->BackendFlags | 2;
  local_48->BackendFlags = local_48->BackendFlags | 4;
  local_48->BackendPlatformName = "imgui_impl_sfml";
  local_48->KeyMap[0x200] = 0x3c;
  local_48->KeyMap[0x201] = 0x47;
  local_48->KeyMap[0x202] = 0x48;
  local_48->KeyMap[0x203] = 0x49;
  local_48->KeyMap[0x204] = 0x4a;
  local_48->KeyMap[0x205] = 0x3d;
  local_48->KeyMap[0x206] = 0x3e;
  local_48->KeyMap[0x207] = 0x40;
  local_48->KeyMap[0x208] = 0x3f;
  local_48->KeyMap[0x209] = 0x41;
  local_48->KeyMap[0x20a] = 0x42;
  local_48->KeyMap[0x20b] = 0x3b;
  local_48->KeyMap[0x20c] = 0x39;
  local_48->KeyMap[0x20d] = 0x3a;
  local_48->KeyMap[0x20e] = 0x24;
  local_48->KeyMap[0x222] = 0;
  local_48->KeyMap[0x224] = 2;
  local_48->KeyMap[0x237] = 0x15;
  local_48->KeyMap[0x239] = 0x17;
  local_48->KeyMap[0x23a] = 0x18;
  local_48->KeyMap[0x23b] = 0x19;
  uVar1 = anon_unknown.dwarf_f6bf2::getConnectedJoystickId();
  (anonymous_namespace)::s_currWindowCtx->joystickId = uVar1;
  anon_unknown.dwarf_f6bf2::initDefaultJoystickMapping();
  ImVec2::ImVec2(&local_50,pVStack_20->x,pVStack_20->y);
  local_48->DisplaySize = local_50;
  local_48->SetClipboardTextFn = anon_unknown.dwarf_f6bf2::setClipboardText;
  local_48->GetClipboardTextFn = anon_unknown.dwarf_f6bf2::getClipboardText;
  anon_unknown.dwarf_f6bf2::loadMouseCursor(0,Arrow);
  anon_unknown.dwarf_f6bf2::loadMouseCursor(1,Text);
  anon_unknown.dwarf_f6bf2::loadMouseCursor(2,SizeAll);
  anon_unknown.dwarf_f6bf2::loadMouseCursor(3,SizeVertical);
  anon_unknown.dwarf_f6bf2::loadMouseCursor(4,SizeHorizontal);
  anon_unknown.dwarf_f6bf2::loadMouseCursor(5,SizeBottomLeftTopRight);
  anon_unknown.dwarf_f6bf2::loadMouseCursor(6,SizeTopLeftBottomRight);
  anon_unknown.dwarf_f6bf2::loadMouseCursor(7,Hand);
  if ((local_21 & 1) == 0) {
    window_local._7_1_ = true;
  }
  else {
    window_local._7_1_ = UpdateFontTexture();
  }
  return window_local._7_1_;
}

Assistant:

bool Init(sf::Window& window, const sf::Vector2f& displaySize, bool loadDefaultFont) {
#if __cplusplus < 201103L // runtime assert when using earlier than C++11 as no
                          // static_assert support
    assert(sizeof(GLuint) <= sizeof(ImTextureID)); // ImTextureID is not large enough to fit
                                                   // GLuint.
#endif

    s_windowContexts.emplace_back(new WindowContext(&window));

    s_currWindowCtx = s_windowContexts.back().get();
    ImGui::SetCurrentContext(s_currWindowCtx->imContext);

    ImGuiIO& io = ImGui::GetIO();

    // tell ImGui which features we support
    io.BackendFlags |= ImGuiBackendFlags_HasGamepad;
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;
    io.BackendPlatformName = "imgui_impl_sfml";

    // init keyboard mapping
    io.KeyMap[ImGuiKey_Tab] = sf::Keyboard::Tab;
    io.KeyMap[ImGuiKey_LeftArrow] = sf::Keyboard::Left;
    io.KeyMap[ImGuiKey_RightArrow] = sf::Keyboard::Right;
    io.KeyMap[ImGuiKey_UpArrow] = sf::Keyboard::Up;
    io.KeyMap[ImGuiKey_DownArrow] = sf::Keyboard::Down;
    io.KeyMap[ImGuiKey_PageUp] = sf::Keyboard::PageUp;
    io.KeyMap[ImGuiKey_PageDown] = sf::Keyboard::PageDown;
    io.KeyMap[ImGuiKey_Home] = sf::Keyboard::Home;
    io.KeyMap[ImGuiKey_End] = sf::Keyboard::End;
    io.KeyMap[ImGuiKey_Insert] = sf::Keyboard::Insert;
    io.KeyMap[ImGuiKey_Delete] = sf::Keyboard::Delete;
    io.KeyMap[ImGuiKey_Backspace] = sf::Keyboard::Backspace;
    io.KeyMap[ImGuiKey_Space] = sf::Keyboard::Space;
    io.KeyMap[ImGuiKey_Enter] = sf::Keyboard::Enter;
    io.KeyMap[ImGuiKey_Escape] = sf::Keyboard::Escape;
    io.KeyMap[ImGuiKey_A] = sf::Keyboard::A;
    io.KeyMap[ImGuiKey_C] = sf::Keyboard::C;
    io.KeyMap[ImGuiKey_V] = sf::Keyboard::V;
    io.KeyMap[ImGuiKey_X] = sf::Keyboard::X;
    io.KeyMap[ImGuiKey_Y] = sf::Keyboard::Y;
    io.KeyMap[ImGuiKey_Z] = sf::Keyboard::Z;

    s_currWindowCtx->joystickId = getConnectedJoystickId();

    initDefaultJoystickMapping();

    // init rendering
    io.DisplaySize = ImVec2(displaySize.x, displaySize.y);

    // clipboard
    io.SetClipboardTextFn = setClipboardText;
    io.GetClipboardTextFn = getClipboardText;

    // load mouse cursors
    loadMouseCursor(ImGuiMouseCursor_Arrow, sf::Cursor::Arrow);
    loadMouseCursor(ImGuiMouseCursor_TextInput, sf::Cursor::Text);
    loadMouseCursor(ImGuiMouseCursor_ResizeAll, sf::Cursor::SizeAll);
    loadMouseCursor(ImGuiMouseCursor_ResizeNS, sf::Cursor::SizeVertical);
    loadMouseCursor(ImGuiMouseCursor_ResizeEW, sf::Cursor::SizeHorizontal);
    loadMouseCursor(ImGuiMouseCursor_ResizeNESW, sf::Cursor::SizeBottomLeftTopRight);
    loadMouseCursor(ImGuiMouseCursor_ResizeNWSE, sf::Cursor::SizeTopLeftBottomRight);
    loadMouseCursor(ImGuiMouseCursor_Hand, sf::Cursor::Hand);

    if (loadDefaultFont) {
        // this will load default font automatically
        // No need to call AddDefaultFont
        return UpdateFontTexture();
    }

    return true;
}